

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void writeBPArmada(Manager *manager,int puzNum)

{
  pointer pBVar1;
  long lVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ostream local_240 [8];
  ofstream file;
  
  std::ofstream::ofstream(local_240,"bpgArmada.txt",_S_out);
  uVar7 = 0;
  uVar4 = (ulong)(uint)puzNum;
  if (puzNum < 1) {
    uVar4 = uVar7;
  }
  for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    std::operator<<(local_240,"\nArmada Format\n");
    lVar6 = 0;
    for (uVar5 = 0;
        pBVar1 = (manager->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar2 = *(long *)&pBVar1[uVar7].armada.super__Vector_base<Ship,_std::allocator<Ship>_>,
        uVar5 < (ulong)(((long)*(pointer *)
                                ((long)&pBVar1[uVar7].armada.
                                        super__Vector_base<Ship,_std::allocator<Ship>_> + 8) - lVar2
                        ) / 0x18); uVar5 = uVar5 + 1) {
      poVar3 = std::operator<<(local_240,*(char *)(lVar2 + lVar6));
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(int *)(*(long *)&(manager->puzzles).
                                                                                                        
                                                  super__Vector_base<Board,_std::allocator<Board>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  armada.
                                                  super__Vector_base<Ship,_std::allocator<Ship>_> +
                                          8 + lVar6));
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(int *)(*(long *)&(manager->puzzles).
                                                                                                        
                                                  super__Vector_base<Board,_std::allocator<Board>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  armada.
                                                  super__Vector_base<Ship,_std::allocator<Ship>_> +
                                          0xc + lVar6));
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,*(char *)(*(long *)&(manager->puzzles).
                                                                                                                    
                                                  super__Vector_base<Board,_std::allocator<Board>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  armada.
                                                  super__Vector_base<Ship,_std::allocator<Ship>_> +
                                                0x10 + lVar6));
      std::operator<<(poVar3,"\n");
      lVar6 = lVar6 + 0x18;
    }
    std::operator<<(local_240,"\n\n\n");
  }
  std::ofstream::close();
  poVar3 = std::operator<<((ostream *)&std::cout,"File saved sucessfully! ;)");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ofstream::~ofstream(local_240);
  return;
}

Assistant:

void writeBPArmada( Manager manager, int puzNum )
{

    std::ofstream file("bpgArmada.txt");

    for( int vec = 0; vec < puzNum; vec++ )
    {
        file << "\nArmada Format\n";
        for( int i = 0; i < manager.puzzles[vec].armada.size(); i++ )
        {
            file << manager.puzzles[vec].armada[i].ID << " "
                 << manager.puzzles[vec].armada[i].sRow << " "
                 << manager.puzzles[vec].armada[i].sCol << " "
                 << manager.puzzles[vec].armada[i].orientation << "\n";
        }

         file << "\n\n\n";
    }

    file.close();

	std::cout << "File saved sucessfully! ;)" << std::endl;
}